

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O0

int Ssw_ManSweepBmcConstr_old(Ssw_Man_t *p)

{
  Vec_Ptr_t *p_00;
  Ssw_Sat_t *p_01;
  FILE *pFile;
  int iVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  Aig_Man_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  abctime aVar9;
  abctime clk;
  int local_40;
  int iLits;
  int f;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Bar_Progress_t *pProgress;
  Ssw_Man_t *p_local;
  
  pObj = (Aig_Obj_t *)0x0;
  aVar4 = Abc_Clock();
  iVar1 = Aig_ManObjNumMax(p->pAig);
  pAVar5 = Aig_ManStart(iVar1 * p->pPars->nFramesK);
  p->pFrames = pAVar5;
  for (iLits = 0; iVar1 = Saig_ManRegNum(p->pAig), iLits < iVar1; iLits = iLits + 1) {
    p_00 = p->pAig->vCis;
    iVar1 = Saig_ManPiNum(p->pAig);
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iLits + iVar1);
    pAVar7 = Aig_ManConst0(p->pFrames);
    Ssw_ObjSetFrame(p,pAVar6,0,pAVar7);
  }
  clk._4_4_ = 0;
  for (local_40 = 0; local_40 < p->pPars->nFramesK; local_40 = local_40 + 1) {
    pAVar6 = Aig_ManConst1(p->pAig);
    pAVar7 = Aig_ManConst1(p->pFrames);
    Ssw_ObjSetFrame(p,pAVar6,local_40,pAVar7);
    for (iLits = 0; iVar1 = Saig_ManPiNum(p->pAig), iLits < iVar1; iLits = iLits + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,iLits);
      pAVar7 = Aig_ObjCreateCi(p->pFrames);
      uVar2 = Vec_IntEntry(p->vInits,clk._4_4_);
      *(ulong *)&pAVar7->field_0x18 =
           *(ulong *)&pAVar7->field_0x18 & 0xfffffffffffffff7 | ((ulong)uVar2 & 1) << 3;
      Ssw_ObjSetFrame(p,pAVar6,local_40,pAVar7);
      clk._4_4_ = clk._4_4_ + 1;
    }
    for (iLits = 0; iVar1 = Saig_ManPoNum(p->pAig), iLits < iVar1; iLits = iLits + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,iLits);
      iVar1 = Saig_ManPoNum(p->pAig);
      iVar3 = Saig_ManConstrNum(p->pAig);
      if (iVar1 - iVar3 <= iLits) {
        pAVar7 = Aig_ObjFanin0(pAVar6);
        pAVar7 = Ssw_ManSweepBmcConstr_rec(p,pAVar7,local_40);
        iVar1 = Aig_ObjFaninC0(pAVar6);
        pAVar6 = Aig_NotCond(pAVar7,iVar1);
        pAVar7 = Aig_Regular(pAVar6);
        pAVar8 = Aig_ManConst1(p->pFrames);
        if (pAVar7 == pAVar8) {
          iVar1 = Aig_IsComplement(pAVar6);
          if (iVar1 == 0) {
            __assert_fail("Aig_IsComplement(pObjNew)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                          ,0x1b9,"int Ssw_ManSweepBmcConstr_old(Ssw_Man_t *)");
          }
        }
        else {
          pAVar7 = Aig_ManConst0(p->pFrames);
          Ssw_NodesAreConstrained(p,pAVar6,pAVar7);
        }
      }
    }
  }
  iVar1 = Vec_IntSize(p->vInits);
  iVar3 = Saig_ManPiNum(p->pAig);
  if (iVar1 != clk._4_4_ + iVar3) {
    __assert_fail("Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                  ,0x1bf,"int Ssw_ManSweepBmcConstr_old(Ssw_Man_t *)");
  }
  p->fRefined = 0;
  pFile = _stdout;
  if (p->pPars->fVerbose != 0) {
    iVar1 = Aig_ManObjNumMax(p->pAig);
    pObj = (Aig_Obj_t *)Bar_ProgressStart(pFile,iVar1 * p->pPars->nFramesK);
  }
  for (local_40 = 0; local_40 < p->pPars->nFramesK; local_40 = local_40 + 1) {
    for (iLits = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), iLits < iVar1; iLits = iLits + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,iLits);
      if ((pAVar6 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar6), iVar1 != 0)) {
        if (p->pPars->fVerbose != 0) {
          iVar1 = Aig_ManObjNumMax(p->pAig);
          Bar_ProgressUpdate((Bar_Progress_t *)pObj,iVar1 * local_40 + iLits,(char *)0x0);
        }
        pAVar5 = p->pFrames;
        pAVar7 = Ssw_ObjChild0Fra(p,pAVar6,local_40);
        pAVar8 = Ssw_ObjChild1Fra(p,pAVar6,local_40);
        pAVar7 = Aig_And(pAVar5,pAVar7,pAVar8);
        Ssw_ObjSetFrame(p,pAVar6,local_40,pAVar7);
        uVar2 = Ssw_ManSweepNodeConstr(p,pAVar6,local_40,1);
        p->fRefined = uVar2 | p->fRefined;
      }
    }
    if (local_40 == p->pPars->nFramesK + -1) break;
    for (iLits = 0; iVar1 = Vec_PtrSize(p->pAig->vCos), iLits < iVar1; iLits = iLits + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,iLits);
      pAVar7 = Ssw_ObjChild0Fra(p,pAVar6,local_40);
      Ssw_ObjSetFrame(p,pAVar6,local_40,pAVar7);
    }
    for (iLits = 0; iVar1 = Saig_ManRegNum(p->pAig), iLits < iVar1; iLits = iLits + 1) {
      pAVar6 = Saig_ManLi(p->pAig,iLits);
      pAVar7 = Saig_ManLo(p->pAig,iLits);
      pAVar6 = Ssw_ObjFrame(p,pAVar6,local_40);
      Ssw_ObjSetFrame(p,pAVar7,local_40 + 1,pAVar6);
      p_01 = p->pMSat;
      pAVar6 = Aig_Regular(pAVar6);
      Ssw_CnfNodeAddToSolver(p_01,pAVar6);
    }
  }
  if (p->pPars->fVerbose != 0) {
    Bar_ProgressStop((Bar_Progress_t *)pObj);
  }
  aVar9 = Abc_Clock();
  p->timeBmc = (aVar9 - aVar4) + p->timeBmc;
  return p->fRefined;
}

Assistant:

int Ssw_ManSweepBmcConstr_old( Ssw_Man_t * p )
{
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObjNew, * pObjLi, * pObjLo;
    int i, f, iLits;
    abctime clk;
clk = Abc_Clock();

    // start initialized timeframes
    p->pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ManConst0(p->pFrames) );

    // build the constraint outputs
    iLits = 0;
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(p->pFrames);
            pObjNew->fPhase = Vec_IntEntry( p->vInits, iLits++ );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // build the constraint cones
        Saig_ManForEachPo( p->pAig, pObj, i )
        {
            if ( i < Saig_ManPoNum(p->pAig) - Saig_ManConstrNum(p->pAig) )
                continue;
            pObjNew = Ssw_ManSweepBmcConstr_rec( p, Aig_ObjFanin0(pObj), f );
            pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObj) );
            if ( Aig_Regular(pObjNew) == Aig_ManConst1(p->pFrames) )
            {
                assert( Aig_IsComplement(pObjNew) );
                continue;
            }
            Ssw_NodesAreConstrained( p, pObjNew, Aig_ManConst0(p->pFrames) );
        }
    }
    assert( Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig) );

    // sweep internal nodes
    p->fRefined = 0;
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) * p->pPars->nFramesK );
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // sweep internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            if ( p->pPars->fVerbose )
                Bar_ProgressUpdate( pProgress, Aig_ManObjNumMax(p->pAig) * f + i, NULL );
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNodeConstr( p, pObj, f, 1 );
        }
        // quit if this is the last timeframe
        if ( f == p->pPars->nFramesK - 1 )
            break;
        // transfer latch input to the latch outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj, f) );
        // build logic cones for register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Ssw_ObjFrame( p, pObjLi, f );
            Ssw_ObjSetFrame( p, pObjLo, f+1, pObjNew );
            Ssw_CnfNodeAddToSolver( p->pMSat, Aig_Regular(pObjNew) );//
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
p->timeBmc += Abc_Clock() - clk;
    return p->fRefined;
}